

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O0

int __thiscall musicBlock::releaseSustain(musicBlock *this,uint channel)

{
  uint local_18;
  uint id;
  uint i;
  uint channel_local;
  musicBlock *this_local;
  
  for (local_18 = 0; local_18 < this->io->OPLchannels; local_18 = local_18 + 1) {
    if ((this->channels[local_18].channel == channel) && ((this->channels[local_18].flags & 2) != 0)
       ) {
      releaseChannel(this,local_18,0);
    }
  }
  return 0;
}

Assistant:

int musicBlock::releaseSustain(uint channel)
{
	uint i;
	uint id = channel;

	for(i = 0; i < io->OPLchannels; i++)
	{
		if (channels[i].channel == id && channels[i].flags & CH_SUSTAIN)
			releaseChannel(i, 0);
	}
	return 0;
}